

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_v7tar.c
# Opt level: O1

int archive_write_v7tar_header(archive_write *a,archive_entry *entry)

{
  undefined4 uVar1;
  int64_t *piVar2;
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  size_t sVar7;
  undefined4 *puVar8;
  undefined8 *puVar9;
  mode_t mVar10;
  wchar_t wVar11;
  int iVar12;
  archive_string_conv *paVar13;
  char *pcVar14;
  size_t sVar15;
  archive_string *paVar16;
  int *piVar17;
  char *pcVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  undefined4 *puVar22;
  int64_t iVar23;
  undefined8 *puVar24;
  uint uVar25;
  undefined1 uVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  size_t copy_length;
  char *p;
  char buff [512];
  size_t local_258;
  char *local_250;
  char *local_248;
  int64_t *local_240;
  archive_string local_238 [4];
  byte abStack_1cf [9];
  undefined1 auStack_1c6 [6];
  undefined2 local_1c0;
  undefined1 auStack_1be [9];
  undefined4 uStack_1b5;
  undefined8 uStack_1b1;
  undefined4 uStack_1a9;
  undefined1 auStack_1a5 [9];
  undefined1 local_19c;
  undefined1 auStack_19b [363];
  
  piVar2 = (int64_t *)a->format_data;
  paVar13 = (archive_string_conv *)piVar2[2];
  if (paVar13 == (archive_string_conv *)0x0) {
    if ((int)piVar2[4] == 0) {
      paVar13 = archive_string_default_conversion_for_write(&a->archive);
      piVar2[3] = (int64_t)paVar13;
      *(undefined4 *)(piVar2 + 4) = 1;
    }
    paVar13 = (archive_string_conv *)piVar2[3];
  }
  pcVar14 = archive_entry_pathname(entry);
  if (pcVar14 == (char *)0x0) {
    archive_set_error(&a->archive,-1,"Can\'t record entry in tar file without pathname");
    return -0x19;
  }
  pcVar14 = archive_entry_hardlink(entry);
  if (((pcVar14 != (char *)0x0) || (pcVar14 = archive_entry_symlink(entry), pcVar14 != (char *)0x0))
     || (mVar10 = archive_entry_filetype(entry), mVar10 != 0x8000)) {
    archive_entry_set_size(entry,0);
  }
  mVar10 = archive_entry_filetype(entry);
  local_240 = piVar2;
  if (((mVar10 == 0x4000) && (pcVar14 = archive_entry_pathname(entry), pcVar14 != (char *)0x0)) &&
     (sVar15 = strlen(pcVar14), pcVar14[sVar15 - 1] != '/')) {
    local_238[0].s = (char *)0x0;
    local_238[0].length = 0;
    local_238[0].buffer_length = 0;
    sVar15 = strlen(pcVar14);
    paVar16 = archive_string_ensure(local_238,sVar15 + 2);
    if (paVar16 == (archive_string *)0x0) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate v7tar data");
    }
    else {
      local_238[0].length = 0;
      archive_strncat(local_238,pcVar14,sVar15);
      archive_strappend_char(local_238,'/');
      archive_entry_copy_pathname(entry,local_238[0].s);
    }
    archive_string_free(local_238);
    if (paVar16 == (archive_string *)0x0) {
      return -0x1e;
    }
  }
  memcpy(local_238,"",0x200);
  wVar11 = _archive_entry_pathname_l(entry,&local_248,&local_258,paVar13);
  if (wVar11 != L'\0') {
    piVar17 = __errno_location();
    pcVar14 = local_248;
    if (*piVar17 != 0xc) {
      pcVar18 = archive_string_conversion_charset_name(paVar13);
      archive_set_error(&a->archive,0x54,"Can\'t translate pathname \'%s\' to %s",pcVar14,pcVar18);
      iVar27 = -0x14;
      goto LAB_00158af2;
    }
    pcVar14 = "Can\'t allocate memory for Pathname";
LAB_00158cc5:
    archive_set_error(&a->archive,0xc,pcVar14);
    iVar27 = -0x1e;
    goto LAB_00158f3f;
  }
  iVar27 = 0;
LAB_00158af2:
  if (local_258 < 100) {
    memcpy(local_238,local_248,local_258);
  }
  else {
    archive_set_error(&a->archive,0x24,"Pathname too long");
    iVar27 = -0x19;
  }
  wVar11 = _archive_entry_hardlink_l(entry,&local_250,&local_258,paVar13);
  if (wVar11 != L'\0') {
    piVar17 = __errno_location();
    pcVar14 = local_250;
    if (*piVar17 != 0xc) {
      pcVar18 = archive_string_conversion_charset_name(paVar13);
      archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar14,pcVar18);
      iVar27 = -0x14;
      goto LAB_00158b7d;
    }
LAB_00158cbe:
    pcVar14 = "Can\'t allocate memory for Linkname";
    goto LAB_00158cc5;
  }
LAB_00158b7d:
  sVar7 = local_258;
  uVar26 = 0x31;
  if (local_258 == 0) {
    wVar11 = _archive_entry_symlink_l(entry,&local_250,&local_258,paVar13);
    uVar26 = 0xff;
    if (wVar11 != L'\0') {
      piVar17 = __errno_location();
      pcVar14 = local_250;
      if (*piVar17 == 0xc) goto LAB_00158cbe;
      pcVar18 = archive_string_conversion_charset_name(paVar13);
      archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar14,pcVar18);
      iVar27 = -0x14;
    }
  }
  if (local_258 != 0) {
    if (99 < local_258) {
      archive_set_error(&a->archive,0x24,"Link contents too long");
      local_258 = 100;
      iVar27 = -0x19;
    }
    memcpy(auStack_19b,local_250,local_258);
  }
  mVar10 = archive_entry_mode(entry);
  uVar25 = 7;
  uVar19 = (ulong)(mVar10 & 0xfff);
  puVar8 = (undefined4 *)((long)abStack_1cf + 1);
  do {
    puVar22 = puVar8;
    uVar20 = uVar19;
    *(byte *)((long)puVar22 + -1) = (byte)uVar20 & 7 | 0x30;
    uVar25 = uVar25 - 1;
    uVar19 = uVar20 >> 3;
    puVar8 = (undefined4 *)((long)puVar22 + -1);
  } while (1 < uVar25);
  if (7 < uVar20) {
    *(undefined2 *)((long)puVar22 + 3) = 0x3737;
    *(undefined4 *)((long)puVar22 + -1) = 0x37373737;
    archive_set_error(&a->archive,0x22,"Numeric mode too large");
    iVar27 = -0x19;
  }
  uVar19 = archive_entry_uid(entry);
  if ((long)uVar19 < 0) {
    abStack_1cf[7] = 0x30;
    abStack_1cf[8] = 0x30;
    abStack_1cf[3] = 0x30;
    abStack_1cf[4] = 0x30;
    abStack_1cf[5] = 0x30;
    abStack_1cf[6] = 0x30;
LAB_00158cf4:
    archive_set_error(&a->archive,0x22,"Numeric user ID too large");
    iVar27 = -0x19;
  }
  else {
    uVar25 = 7;
    puVar8 = (undefined4 *)auStack_1c6;
    do {
      puVar22 = puVar8;
      uVar20 = uVar19;
      *(byte *)((long)puVar22 + -1) = (byte)uVar20 & 7 | 0x30;
      uVar25 = uVar25 - 1;
      uVar19 = uVar20 >> 3;
      puVar8 = (undefined4 *)((long)puVar22 + -1);
    } while (1 < uVar25);
    if (7 < uVar20) {
      *(undefined2 *)((long)puVar22 + 3) = 0x3737;
      *(undefined4 *)((long)puVar22 + -1) = 0x37373737;
      goto LAB_00158cf4;
    }
  }
  uVar19 = archive_entry_gid(entry);
  if ((long)uVar19 < 0) {
    local_1c0 = 0x3030;
    auStack_1c6._2_4_ = 0x30303030;
LAB_00158d72:
    archive_set_error(&a->archive,0x22,"Numeric group ID too large");
    iVar27 = -0x19;
  }
  else {
    uVar25 = 7;
    puVar8 = (undefined4 *)auStack_1be;
    do {
      puVar22 = puVar8;
      uVar20 = uVar19;
      *(byte *)((long)puVar22 + -1) = (byte)uVar20 & 7 | 0x30;
      uVar25 = uVar25 - 1;
      uVar19 = uVar20 >> 3;
      puVar8 = (undefined4 *)((long)puVar22 + -1);
    } while (1 < uVar25);
    if (7 < uVar20) {
      *(undefined2 *)((long)puVar22 + 3) = 0x3737;
      *(undefined4 *)((long)puVar22 + -1) = 0x37373737;
      goto LAB_00158d72;
    }
  }
  uVar19 = archive_entry_size(entry);
  if ((long)uVar19 < 0) {
    auStack_1be._2_7_ = 0x30303030303030;
    uStack_1b5 = 0x30303030;
LAB_00158e00:
    archive_set_error(&a->archive,0x22,"File size out of range");
    iVar27 = -0x19;
  }
  else {
    uVar25 = 0xc;
    puVar9 = &uStack_1b1;
    do {
      puVar24 = puVar9;
      uVar20 = uVar19;
      *(byte *)((long)puVar24 + -1) = (byte)uVar20 & 7 | 0x30;
      uVar25 = uVar25 - 1;
      uVar19 = uVar20 >> 3;
      puVar9 = (undefined8 *)((long)puVar24 + -1);
    } while (1 < uVar25);
    if (7 < uVar20) {
      *(undefined8 *)((long)puVar24 + -1) = 0x3737373737373737;
      *(undefined4 *)((long)puVar24 + 6) = 0x37373737;
      goto LAB_00158e00;
    }
  }
  uVar19 = archive_entry_mtime(entry);
  if ((long)uVar19 < 0) {
    uStack_1b1._1_7_ = 0x30303030303030;
    uStack_1a9 = 0x30303030;
LAB_00158e8e:
    archive_set_error(&a->archive,0x22,"File modification time too large");
    iVar27 = -0x19;
  }
  else {
    uVar25 = 0xc;
    puVar9 = (undefined8 *)auStack_1a5;
    do {
      puVar24 = puVar9;
      uVar20 = uVar19;
      *(byte *)((long)puVar24 + -1) = (byte)uVar20 & 7 | 0x30;
      uVar25 = uVar25 - 1;
      uVar19 = uVar20 >> 3;
      puVar9 = (undefined8 *)((long)puVar24 + -1);
    } while (1 < uVar25);
    if (7 < uVar20) {
      *(undefined8 *)((long)puVar24 + -1) = 0x3737373737373737;
      *(undefined4 *)((long)puVar24 + 6) = 0x37373737;
      goto LAB_00158e8e;
    }
  }
  if (sVar7 != 0) {
    local_19c = uVar26;
    goto switchD_00158fbc_caseD_3;
  }
  mVar10 = archive_entry_filetype(entry);
  switch(mVar10 << 0x14 | mVar10 - 0x1000 >> 0xc) {
  case 0:
    pcVar14 = "tar format cannot archive fifo";
    break;
  case 1:
    pcVar14 = "tar format cannot archive character device";
    break;
  default:
    mVar10 = archive_entry_mode(entry);
    archive_set_error(&a->archive,0x54,"tar format cannot archive this (mode=0%lo)",(ulong)mVar10);
    iVar27 = -0x19;
  case 3:
  case 7:
    goto switchD_00158fbc_caseD_3;
  case 5:
    pcVar14 = "tar format cannot archive block device";
    break;
  case 9:
    local_19c = 0x32;
    goto switchD_00158fbc_caseD_3;
  case 0xb:
    pcVar14 = "tar format cannot archive socket";
  }
  archive_set_error(&a->archive,0x54,pcVar14);
  iVar27 = -0x19;
LAB_00158f3f:
  iVar12 = iVar27;
  if ((-0x15 < iVar27) && (iVar12 = __archive_write_output(a,local_238,0x200), -0x15 < iVar12)) {
    if (iVar27 <= iVar12) {
      iVar12 = iVar27;
    }
    iVar23 = archive_entry_size(entry);
    *local_240 = iVar23;
    local_240[1] = (ulong)(-(int)iVar23 & 0x1ff);
  }
  return iVar12;
switchD_00158fbc_caseD_3:
  lVar21 = 0;
  iVar12 = 0;
  iVar28 = 0;
  iVar29 = 0;
  iVar30 = 0;
  do {
    uVar1 = *(undefined4 *)((long)&local_238[0].s + lVar21);
    uVar19 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
    auVar3._8_4_ = 0;
    auVar3._0_8_ = uVar19;
    auVar3[0xc] = (char)((uint)uVar1 >> 0x18);
    auVar4[8] = (char)((uint)uVar1 >> 0x10);
    auVar4._0_8_ = uVar19;
    auVar4[9] = 0;
    auVar4._10_3_ = auVar3._10_3_;
    auVar6._5_8_ = 0;
    auVar6._0_5_ = auVar4._8_5_;
    auVar5[4] = (char)((uint)uVar1 >> 8);
    auVar5._0_4_ = (int)uVar19;
    auVar5[5] = 0;
    auVar5._6_7_ = SUB137(auVar6 << 0x40,6);
    iVar12 = iVar12 + (int)uVar19;
    iVar28 = iVar28 + auVar5._4_4_;
    iVar29 = iVar29 + auVar4._8_4_;
    iVar30 = iVar30 + (uint)(uint3)(auVar3._10_3_ >> 0x10);
    lVar21 = lVar21 + 4;
  } while (lVar21 != 0x200);
  uVar25 = 7;
  puVar8 = (undefined4 *)(auStack_1a5 + 7);
  uVar19 = (ulong)(uint)(iVar30 + iVar28 + iVar29 + iVar12);
  do {
    uVar20 = uVar19;
    puVar22 = puVar8;
    *(byte *)((long)puVar22 + -1) = (byte)uVar20 & 7 | 0x30;
    uVar25 = uVar25 - 1;
    puVar8 = (undefined4 *)((long)puVar22 + -1);
    uVar19 = uVar20 >> 3;
  } while (1 < uVar25);
  if (7 < uVar20) {
    *(undefined2 *)((long)puVar22 + 3) = 0x3737;
    *(undefined4 *)((long)puVar22 + -1) = 0x37373737;
  }
  auStack_1a5[7] = 0;
  goto LAB_00158f3f;
}

Assistant:

static int
archive_write_v7tar_header(struct archive_write *a, struct archive_entry *entry)
{
	char buff[512];
	int ret, ret2;
	struct v7tar *v7tar;
	struct archive_entry *entry_main;
	struct archive_string_conv *sconv;

	v7tar = (struct v7tar *)a->format_data;

	/* Setup default string conversion. */
	if (v7tar->opt_sconv == NULL) {
		if (!v7tar->init_default_conversion) {
			v7tar->sconv_default =
			    archive_string_default_conversion_for_write(
				&(a->archive));
			v7tar->init_default_conversion = 1;
		}
		sconv = v7tar->sconv_default;
	} else
		sconv = v7tar->opt_sconv;

	/* Sanity check. */
	if (archive_entry_pathname(entry) == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Can't record entry in tar file without pathname");
		return (ARCHIVE_FAILED);
	}

	/* Only regular files (not hardlinks) have data. */
	if (archive_entry_hardlink(entry) != NULL ||
	    archive_entry_symlink(entry) != NULL ||
	    !(archive_entry_filetype(entry) == AE_IFREG))
		archive_entry_set_size(entry, 0);

	if (AE_IFDIR == archive_entry_filetype(entry)) {
		const char *p;
		size_t path_length;
		/*
		 * Ensure a trailing '/'.  Modify the entry so
		 * the client sees the change.
		 */
#if defined(_WIN32) && !defined(__CYGWIN__)
		const wchar_t *wp;

		wp = archive_entry_pathname_w(entry);
		if (wp != NULL && wp[wcslen(wp) -1] != L'/') {
			struct archive_wstring ws;

			archive_string_init(&ws);
			path_length = wcslen(wp);
			if (archive_wstring_ensure(&ws,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate v7tar data");
				archive_wstring_free(&ws);
				return(ARCHIVE_FATAL);
			}
			/* Should we keep '\' ? */
			if (wp[path_length -1] == L'\\')
				path_length--;
			archive_wstrncpy(&ws, wp, path_length);
			archive_wstrappend_wchar(&ws, L'/');
			archive_entry_copy_pathname_w(entry, ws.s);
			archive_wstring_free(&ws);
			p = NULL;
		} else
#endif
			p = archive_entry_pathname(entry);
		/*
		 * On Windows, this is a backup operation just in
		 * case getting WCS failed. On POSIX, this is a
		 * normal operation.
		 */
		if (p != NULL && p[strlen(p) - 1] != '/') {
			struct archive_string as;

			archive_string_init(&as);
			path_length = strlen(p);
			if (archive_string_ensure(&as,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate v7tar data");
				archive_string_free(&as);
				return(ARCHIVE_FATAL);
			}
#if defined(_WIN32) && !defined(__CYGWIN__)
			/* NOTE: This might break the pathname
			 * if the current code page is CP932 and
			 * the pathname includes a character '\'
			 * as a part of its multibyte pathname. */
			if (p[strlen(p) -1] == '\\')
				path_length--;
			else
#endif
			archive_strncpy(&as, p, path_length);
			archive_strappend_char(&as, '/');
			archive_entry_copy_pathname(entry, as.s);
			archive_string_free(&as);
		}
	}

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pahtname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	entry_main = __la_win_entry_in_posix_pathseparator(entry);
	if (entry_main == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate v7tar data");
		return(ARCHIVE_FATAL);
	}
	if (entry != entry_main)
		entry = entry_main;
	else
		entry_main = NULL;
#else
	entry_main = NULL;
#endif
	ret = format_header_v7tar(a, buff, entry, 1, sconv);
	if (ret < ARCHIVE_WARN) {
		if (entry_main)
			archive_entry_free(entry_main);
		return (ret);
	}
	ret2 = __archive_write_output(a, buff, 512);
	if (ret2 < ARCHIVE_WARN) {
		if (entry_main)
			archive_entry_free(entry_main);
		return (ret2);
	}
	if (ret2 < ret)
		ret = ret2;

	v7tar->entry_bytes_remaining = archive_entry_size(entry);
	v7tar->entry_padding = 0x1ff & (-(int64_t)v7tar->entry_bytes_remaining);
	if (entry_main)
		archive_entry_free(entry_main);
	return (ret);
}